

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

int aom_img_set_rect(aom_image_t *img,uint x,uint y,uint w,uint h,uint border)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uv_y;
  uint uv_x;
  uint uv_border_h;
  uchar *data;
  int bytes_per_sample;
  uint border_local;
  uint h_local;
  uint w_local;
  uint y_local;
  uint x_local;
  aom_image_t *img_local;
  int local_4;
  
  if ((((-w - 1 < x) || (img->w < x + w)) || (-h - 1 < y)) || (img->h < y + h)) {
    local_4 = -1;
  }
  else {
    img->d_w = w;
    img->d_h = h;
    uVar2 = border + x;
    uVar3 = border + y;
    if ((img->fmt & 0x100) == AOM_IMG_FMT_NONE) {
      img->planes[0] =
           img->img_data + (ulong)(uVar3 * img->stride[0]) + (ulong)(uVar2 * img->bps >> 3);
    }
    else {
      iVar4 = 1;
      if ((img->fmt & 0x800) != AOM_IMG_FMT_NONE) {
        iVar4 = 2;
      }
      puVar1 = img->img_data;
      img->planes[0] = puVar1 + (ulong)(uVar3 * img->stride[0]) + (ulong)(uVar2 * iVar4);
      lVar6 = ((ulong)img->h + (ulong)(border << 1)) * (long)img->stride[0];
      uVar5 = border >> ((byte)img->y_chroma_shift & 0x1f);
      uVar2 = uVar2 >> ((byte)img->x_chroma_shift & 0x1f);
      uVar3 = uVar3 >> ((byte)img->y_chroma_shift & 0x1f);
      if (img->fmt == AOM_IMG_FMT_NV12) {
        img->planes[1] =
             puVar1 + (ulong)(uVar3 * img->stride[1]) + (ulong)(uVar2 * iVar4 * 2) + lVar6;
        img->planes[2] = (uchar *)0x0;
      }
      else if ((img->fmt & 0x200) == AOM_IMG_FMT_NONE) {
        img->planes[1] = puVar1 + (ulong)(uVar3 * img->stride[1]) + (ulong)(uVar2 * iVar4) + lVar6;
        img->planes[2] =
             puVar1 + (ulong)(uVar3 * img->stride[2]) +
                      (ulong)(uVar2 * iVar4) +
                      ((ulong)(img->h >> ((byte)img->y_chroma_shift & 0x1f)) + (ulong)(uVar5 << 1))
                      * (long)img->stride[1] + lVar6;
      }
      else {
        img->planes[2] = puVar1 + (ulong)(uVar3 * img->stride[2]) + (ulong)(uVar2 * iVar4) + lVar6;
        img->planes[1] =
             puVar1 + (ulong)(uVar3 * img->stride[1]) +
                      (ulong)(uVar2 * iVar4) +
                      ((ulong)(img->h >> ((byte)img->y_chroma_shift & 0x1f)) + (ulong)(uVar5 << 1))
                      * (long)img->stride[2] + lVar6;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_img_set_rect(aom_image_t *img, unsigned int x, unsigned int y,
                     unsigned int w, unsigned int h, unsigned int border) {
  if (x <= UINT_MAX - w && x + w <= img->w && y <= UINT_MAX - h &&
      y + h <= img->h) {
    img->d_w = w;
    img->d_h = h;

    x += border;
    y += border;

    /* Calculate plane pointers */
    if (!(img->fmt & AOM_IMG_FMT_PLANAR)) {
      img->planes[AOM_PLANE_PACKED] =
          img->img_data + x * img->bps / 8 + y * img->stride[AOM_PLANE_PACKED];
    } else {
      const int bytes_per_sample =
          (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;
      unsigned char *data = img->img_data;

      img->planes[AOM_PLANE_Y] =
          data + x * bytes_per_sample + y * img->stride[AOM_PLANE_Y];
      data += ((size_t)img->h + 2 * border) * img->stride[AOM_PLANE_Y];

      unsigned int uv_border_h = border >> img->y_chroma_shift;
      unsigned int uv_x = x >> img->x_chroma_shift;
      unsigned int uv_y = y >> img->y_chroma_shift;
      if (img->fmt == AOM_IMG_FMT_NV12) {
        img->planes[AOM_PLANE_U] = data + uv_x * bytes_per_sample * 2 +
                                   uv_y * img->stride[AOM_PLANE_U];
        img->planes[AOM_PLANE_V] = NULL;
      } else if (!(img->fmt & AOM_IMG_FMT_UV_FLIP)) {
        img->planes[AOM_PLANE_U] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_U];
        data += ((size_t)(img->h >> img->y_chroma_shift) + 2 * uv_border_h) *
                img->stride[AOM_PLANE_U];
        img->planes[AOM_PLANE_V] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_V];
      } else {
        img->planes[AOM_PLANE_V] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_V];
        data += ((size_t)(img->h >> img->y_chroma_shift) + 2 * uv_border_h) *
                img->stride[AOM_PLANE_V];
        img->planes[AOM_PLANE_U] =
            data + uv_x * bytes_per_sample + uv_y * img->stride[AOM_PLANE_U];
      }
    }
    return 0;
  }
  return -1;
}